

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sg_diag_sse2_128_32.c
# Opt level: O1

parasail_result_t *
parasail_sg_flags_diag_sse2_128_32
          (char *_s1,int _s1Len,char *_s2,int s2Len,int open,int gap,parasail_matrix_t *matrix,
          int s1_beg,int s1_end,int s2_beg,int s2_end)

{
  int *piVar1;
  int iVar2;
  uint uVar3;
  parasail_result_t *ppVar4;
  int32_t *ptr;
  int32_t *ptr_00;
  int32_t *ptr_01;
  int32_t *ptr_02;
  long lVar5;
  ulong uVar6;
  ulong uVar7;
  ulong uVar8;
  int iVar9;
  uint uVar10;
  int iVar11;
  uint uVar12;
  uint uVar13;
  uint uVar14;
  uint uVar15;
  uint uVar16;
  undefined1 auVar17 [16];
  undefined1 auVar18 [16];
  uint uVar19;
  uint uVar20;
  uint uVar21;
  uint uVar22;
  uint uVar23;
  uint uVar24;
  uint uVar25;
  uint uVar26;
  uint uVar27;
  uint uVar28;
  uint uVar29;
  uint uVar30;
  int32_t iVar31;
  uint uVar32;
  uint uVar33;
  uint uVar34;
  uint uVar35;
  uint uVar36;
  uint uVar37;
  uint uVar38;
  uint uVar39;
  uint uVar40;
  uint uVar41;
  uint uVar42;
  uint uVar43;
  uint uVar44;
  uint uVar45;
  uint uVar46;
  uint uVar47;
  uint uVar48;
  uint uVar49;
  uint uVar50;
  uint uVar51;
  uint uVar52;
  __m128i vMaxHCol;
  __m128i vMaxHRow;
  uint local_1b8;
  uint uStack_1b4;
  uint uStack_1b0;
  uint uStack_1ac;
  undefined1 local_198 [16];
  uint local_178;
  uint uStack_174;
  uint uStack_170;
  uint uStack_16c;
  undefined1 local_158 [16];
  uint local_138 [4];
  uint local_128;
  uint uStack_124;
  uint uStack_120;
  uint uStack_11c;
  uint local_118;
  uint uStack_114;
  uint uStack_110;
  uint uStack_10c;
  uint local_108 [4];
  uint local_f8 [4];
  uint local_e8 [4];
  uint local_d8 [4];
  ulong local_c8;
  int *local_c0;
  int local_b8;
  int iStack_b4;
  int iStack_b0;
  int iStack_ac;
  undefined1 local_a8 [16];
  uint local_98;
  uint uStack_94;
  uint uStack_90;
  uint uStack_8c;
  uint local_88;
  uint uStack_84;
  uint uStack_80;
  uint uStack_7c;
  int local_78;
  int iStack_74;
  int iStack_70;
  int iStack_6c;
  uint local_68;
  uint uStack_64;
  uint uStack_60;
  uint uStack_5c;
  uint local_58;
  uint uStack_54;
  uint uStack_50;
  uint uStack_4c;
  int local_48;
  int iStack_44;
  int iStack_40;
  int iStack_3c;
  
  if (_s2 == (char *)0x0) {
    parasail_sg_flags_diag_sse2_128_32_cold_7();
  }
  else {
    uVar8 = (ulong)(uint)s2Len;
    if (s2Len < 1) {
      parasail_sg_flags_diag_sse2_128_32_cold_6();
    }
    else if (open < 0) {
      parasail_sg_flags_diag_sse2_128_32_cold_5();
    }
    else if (gap < 0) {
      parasail_sg_flags_diag_sse2_128_32_cold_4();
    }
    else if (matrix == (parasail_matrix_t *)0x0) {
      parasail_sg_flags_diag_sse2_128_32_cold_3();
    }
    else {
      if (matrix->type == 0) {
        if (_s1 == (char *)0x0) {
          parasail_sg_flags_diag_sse2_128_32_cold_2();
          return (parasail_result_t *)0x0;
        }
        if (_s1Len < 1) {
          parasail_sg_flags_diag_sse2_128_32_cold_1();
          return (parasail_result_t *)0x0;
        }
      }
      else {
        _s1Len = matrix->length;
      }
      iVar2 = _s1Len + 3;
      uVar15 = s2Len + 3;
      iVar11 = -open;
      iVar9 = matrix->min;
      uVar16 = 0x80000000 - iVar9;
      if (iVar9 != iVar11 && SBORROW4(iVar9,iVar11) == iVar9 + open < 0) {
        uVar16 = open | 0x80000000;
      }
      uVar16 = uVar16 + 1;
      uVar14 = 0x7ffffffe - matrix->max;
      local_b8 = 0;
      iStack_b4 = 0;
      iStack_b0 = 0;
      iStack_ac = 0;
      local_158 = (undefined1  [16])0x0;
      if (s1_beg == 0) {
        local_b8 = gap << 2;
        iStack_b4 = gap << 2;
        iStack_b0 = gap << 2;
        iStack_ac = gap << 2;
        local_158._4_4_ = iVar11 + gap * -2;
        local_158._0_4_ = -(gap * 3 + open);
        local_158._12_4_ = iVar11;
        local_158._8_4_ = iVar11 - gap;
      }
      local_48 = gap;
      iStack_44 = gap;
      iStack_40 = gap;
      iStack_3c = gap;
      local_d8[0] = uVar16;
      local_d8[1] = uVar16;
      local_138[0] = uVar16;
      local_138[1] = uVar16;
      local_108[0] = uVar16;
      local_108[1] = uVar16;
      local_f8[0] = uVar16;
      local_f8[1] = uVar16;
      local_e8[0] = uVar16;
      local_e8[1] = uVar16;
      local_d8[2] = uVar16;
      local_d8[3] = uVar16;
      local_138[2] = uVar16;
      local_138[3] = uVar16;
      local_108[2] = uVar16;
      local_108[3] = uVar16;
      local_f8[2] = uVar16;
      local_f8[3] = uVar16;
      local_e8[2] = uVar16;
      local_e8[3] = uVar16;
      ppVar4 = parasail_result_new();
      if (ppVar4 != (parasail_result_t *)0x0) {
        ppVar4->flag = (uint)(s1_end != 0) * 0x10 + (uint)(s1_beg != 0) * 8 |
                       (uint)(s2_beg != 0) << 0xe | (uint)(s2_end != 0) << 0xf | ppVar4->flag |
                       0x4401002;
        uVar6 = (ulong)(s2Len + 6);
        local_118 = open;
        ptr = parasail_memalign_int32_t(0x10,uVar6);
        ptr_00 = parasail_memalign_int32_t(0x10,uVar6);
        ptr_01 = parasail_memalign_int32_t(0x10,uVar6);
        if (ptr_01 != (int32_t *)0x0 && (ptr_00 != (int32_t *)0x0 && ptr != (int32_t *)0x0)) {
          if (matrix->type == 0) {
            ptr_02 = parasail_memalign_int32_t(0x10,(long)iVar2);
            if (ptr_02 == (int32_t *)0x0) {
              return (parasail_result_t *)0x0;
            }
            if (0 < _s1Len) {
              piVar1 = matrix->mapper;
              uVar6 = 0;
              do {
                ptr_02[uVar6] = piVar1[(byte)_s1[uVar6]];
                uVar6 = uVar6 + 1;
              } while ((uint)_s1Len != uVar6);
            }
            iVar9 = _s1Len + 1U;
            if ((int)(_s1Len + 1U) < iVar2) {
              iVar9 = iVar2;
            }
            memset(ptr_02 + _s1Len,0,(ulong)(uint)(~_s1Len + iVar9) * 4 + 4);
          }
          else {
            ptr_02 = (int32_t *)0x0;
          }
          local_88 = local_118;
          uStack_84 = local_118;
          uStack_80 = local_118;
          uStack_7c = local_118;
          local_98 = _s1Len - 1;
          uStack_94 = _s1Len - 1;
          uStack_90 = _s1Len - 1;
          uStack_8c = _s1Len - 1;
          local_68 = s2Len - 1;
          uStack_64 = s2Len - 1;
          uStack_60 = s2Len - 1;
          uStack_5c = s2Len - 1;
          piVar1 = matrix->mapper;
          uVar6 = 1;
          if (1 < s2Len) {
            uVar6 = uVar8;
          }
          uVar7 = 0;
          do {
            ptr[uVar7 + 3] = piVar1[(byte)_s2[uVar7]];
            uVar7 = uVar7 + 1;
          } while (uVar6 != uVar7);
          ptr[2] = 0;
          ptr[0] = 0;
          ptr[1] = 0;
          uVar10 = s2Len + 1U;
          if ((int)(s2Len + 1U) < (int)uVar15) {
            uVar10 = uVar15;
          }
          local_128 = uVar14;
          uStack_124 = uVar14;
          uStack_120 = uVar14;
          uStack_11c = uVar14;
          local_78 = s2Len;
          iStack_74 = s2Len;
          iStack_70 = s2Len;
          iStack_6c = s2Len;
          local_58 = _s1Len;
          uStack_54 = _s1Len;
          uStack_50 = _s1Len;
          uStack_4c = _s1Len;
          memset(ptr + uVar8 + 3,0,(ulong)(~s2Len + uVar10) * 4 + 4);
          uVar6 = 1;
          if (1 < s2Len) {
            uVar6 = uVar8;
          }
          uVar7 = 0;
          iVar9 = iVar11;
          if (s2_beg == 0) {
            do {
              ptr_00[uVar7 + 3] = iVar9;
              ptr_01[uVar7 + 3] = uVar16;
              uVar7 = uVar7 + 1;
              iVar9 = iVar9 - gap;
            } while (uVar6 != uVar7);
          }
          else {
            do {
              ptr_00[uVar7 + 3] = 0;
              ptr_01[uVar7 + 3] = uVar16;
              uVar7 = uVar7 + 1;
            } while (uVar6 != uVar7);
          }
          lVar5 = 0;
          do {
            ptr_00[lVar5] = uVar16;
            ptr_01[lVar5] = uVar16;
            lVar5 = lVar5 + 1;
          } while (lVar5 != 3);
          lVar5 = uVar8 + 3;
          do {
            ptr_00[lVar5] = uVar16;
            ptr_01[lVar5] = uVar16;
            lVar5 = lVar5 + 1;
            uVar14 = (int)uVar8 + 1;
            uVar8 = (ulong)uVar14;
          } while ((int)uVar14 < (int)uVar15);
          ptr_00[2] = 0;
          if (_s1Len < 1) {
            local_198._4_4_ = uVar16;
            local_198._0_4_ = uVar16;
            local_198._12_4_ = uVar16;
            local_198._8_4_ = uVar16;
            local_1b8 = local_128;
            uStack_1b4 = uStack_124;
            uStack_1b0 = uStack_120;
            uStack_1ac = uStack_11c;
          }
          else {
            local_c0 = matrix->matrix;
            uVar14 = _s1Len - 1;
            local_198._4_4_ = uVar16;
            local_198._0_4_ = uVar16;
            local_198._8_4_ = uVar16;
            local_198._12_4_ = uVar16;
            local_a8 = local_198 >> 0x20;
            uVar8 = 1;
            if (1 < (int)uVar15) {
              uVar8 = (ulong)uVar15;
            }
            local_c8 = (ulong)(uint)_s1Len;
            local_178 = 3;
            uStack_174 = 2;
            uStack_170 = 1;
            uStack_16c = 0;
            uVar6 = 0;
            local_1b8 = local_128;
            uStack_1b4 = uStack_124;
            uStack_1b0 = uStack_120;
            uStack_1ac = uStack_11c;
            uVar7 = local_c8;
            do {
              iVar9 = matrix->type;
              uVar10 = (uint)uVar6;
              uVar15 = uVar10;
              if (iVar9 == 0) {
                uVar15 = ptr_02[uVar6];
              }
              if (iVar9 == 0) {
                uVar12 = ptr_02[uVar6 | 1];
              }
              else {
                uVar12 = uVar10 | 1;
                if (uVar7 <= (uVar6 | 1)) {
                  uVar12 = uVar14;
                }
              }
              if (iVar9 == 0) {
                uVar13 = ptr_02[uVar6 | 2];
              }
              else {
                uVar13 = uVar10 | 2;
                if (uVar7 <= (uVar6 | 2)) {
                  uVar13 = uVar14;
                }
              }
              if (iVar9 == 0) {
                uVar3 = ptr_02[uVar6 | 3];
              }
              else {
                uVar3 = uVar10 | 3;
                if (uVar7 <= (uVar6 | 3)) {
                  uVar3 = uVar14;
                }
              }
              iVar9 = matrix->size;
              uVar6 = uVar6 + 4;
              uVar10 = iVar11 - uVar10 * gap;
              iVar31 = ptr_00[2];
              ptr_00[2] = iVar11 - (int)uVar6 * gap;
              if (s1_beg != 0) {
                uVar10 = 0;
              }
              local_118 = -(uint)(local_98 == local_178);
              uStack_114 = -(uint)(uStack_94 == uStack_174);
              uStack_110 = -(uint)(uStack_90 == uStack_170);
              uStack_10c = -(uint)(uStack_8c == uStack_16c);
              uVar7 = 0;
              uVar27 = 0xfffffffd;
              uVar28 = 0xfffffffe;
              uVar29 = 0xffffffff;
              uVar30 = 0;
              uVar32 = uVar16;
              uVar33 = uVar16;
              uVar34 = uVar16;
              uVar44 = uVar16;
              uVar48 = uVar16;
              uVar50 = uVar16;
              uVar36 = uVar16;
              uVar38 = uVar16;
              uVar40 = uVar16;
              uVar19 = uVar16;
              uVar45 = uVar16;
              uVar46 = uVar16;
              uVar47 = uVar16;
              do {
                iVar2 = ptr_00[uVar7 + 3];
                uVar35 = iVar2 - uStack_7c;
                uVar20 = -(uint)((int)(uVar45 - local_48) < (int)(uVar48 - local_88));
                uVar21 = -(uint)((int)(uVar46 - iStack_44) < (int)(uVar50 - uStack_84));
                uVar23 = -(uint)((int)(uVar47 - iStack_40) < (int)(uVar10 - uStack_80));
                uVar25 = -(uint)(ptr_01[uVar7 + 3] - iStack_3c < (int)uVar35);
                uVar20 = ~uVar20 & uVar45 - local_48 | uVar48 - local_88 & uVar20;
                uVar45 = ~uVar21 & uVar46 - iStack_44 | uVar50 - uStack_84 & uVar21;
                uVar46 = ~uVar23 & uVar47 - iStack_40 | uVar10 - uStack_80 & uVar23;
                uVar47 = ~uVar25 & ptr_01[uVar7 + 3] - iStack_3c | uVar35 & uVar25;
                uVar21 = -(uint)((int)(uVar36 - local_48) < (int)(uVar44 - local_88));
                uVar23 = -(uint)((int)(uVar38 - iStack_44) < (int)(uVar48 - uStack_84));
                uVar25 = -(uint)((int)(uVar40 - iStack_40) < (int)(uVar50 - uStack_80));
                uVar35 = -(uint)((int)(uVar19 - iStack_3c) < (int)(uVar10 - uStack_7c));
                uVar36 = ~uVar21 & uVar36 - local_48 | uVar44 - local_88 & uVar21;
                uVar38 = ~uVar23 & uVar38 - iStack_44 | uVar48 - uStack_84 & uVar23;
                uVar40 = ~uVar25 & uVar40 - iStack_40 | uVar50 - uStack_80 & uVar25;
                uVar42 = ~uVar35 & uVar19 - iStack_3c | uVar10 - uStack_7c & uVar35;
                uVar44 = -(uint)((int)uVar36 <
                                (int)(local_c0[(long)(int)(uVar3 * iVar9) + (long)ptr[uVar7]] +
                                     uVar32));
                uVar21 = -(uint)((int)uVar38 <
                                (int)(local_c0[(long)(int)(uVar13 * iVar9) + (long)ptr[uVar7 + 1]] +
                                     uVar33));
                uVar25 = -(uint)((int)uVar40 <
                                (int)(local_c0[(long)(int)(uVar12 * iVar9) + (long)ptr[uVar7 + 2]] +
                                     uVar34));
                uVar35 = -(uint)((int)uVar42 <
                                local_c0[(long)(int)(uVar15 * iVar9) + (long)ptr[uVar7 + 3]] +
                                iVar31);
                uVar19 = ~uVar44 & uVar36 |
                         local_c0[(long)(int)(uVar3 * iVar9) + (long)ptr[uVar7]] + uVar32 & uVar44;
                uVar23 = ~uVar21 & uVar38 |
                         local_c0[(long)(int)(uVar13 * iVar9) + (long)ptr[uVar7 + 1]] + uVar33 &
                         uVar21;
                uVar25 = ~uVar25 & uVar40 |
                         local_c0[(long)(int)(uVar12 * iVar9) + (long)ptr[uVar7 + 2]] + uVar34 &
                         uVar25;
                uVar35 = ~uVar35 & uVar42 |
                         local_c0[(long)(int)(uVar15 * iVar9) + (long)ptr[uVar7 + 3]] + iVar31 &
                         uVar35;
                uVar32 = -(uint)((int)uVar20 < (int)uVar19);
                uVar33 = -(uint)((int)uVar45 < (int)uVar23);
                uVar34 = -(uint)((int)uVar46 < (int)uVar25);
                uVar44 = -(uint)((int)uVar47 < (int)uVar35);
                uVar21 = ~uVar32 & uVar20 | uVar19 & uVar32;
                uVar23 = ~uVar33 & uVar45 | uVar23 & uVar33;
                uVar25 = ~uVar34 & uVar46 | uVar25 & uVar34;
                uVar35 = ~uVar44 & uVar47 | uVar35 & uVar44;
                uVar32 = -(uint)(uVar27 == 0xffffffff);
                uVar33 = -(uint)(uVar28 == 0xffffffff);
                uVar34 = -(uint)(uVar29 == 0xffffffff);
                uVar19 = -(uint)(uVar30 == 0xffffffff);
                uVar44 = local_158._0_4_ & uVar32 | ~uVar32 & uVar21;
                uVar49 = local_158._4_4_ & uVar33 | ~uVar33 & uVar23;
                uVar51 = local_158._8_4_ & uVar34 | ~uVar34 & uVar25;
                uVar52 = local_158._12_4_ & uVar19 | ~uVar19 & uVar35;
                uVar45 = ~uVar33 & uVar45 | uVar16 & uVar33;
                uVar46 = ~uVar34 & uVar46 | uVar16 & uVar34;
                uVar47 = ~uVar19 & uVar47 | uVar16 & uVar19;
                if (3 < uVar7) {
                  local_1b8 = ~-(uint)((int)uVar44 < (int)local_1b8) & local_1b8 |
                              uVar44 & -(uint)((int)uVar44 < (int)local_1b8);
                  uStack_1b4 = ~-(uint)((int)uVar49 < (int)uStack_1b4) & uStack_1b4 |
                               uVar49 & -(uint)((int)uVar49 < (int)uStack_1b4);
                  uStack_1b0 = ~-(uint)((int)uVar51 < (int)uStack_1b0) & uStack_1b0 |
                               uVar51 & -(uint)((int)uVar51 < (int)uStack_1b0);
                  uStack_1ac = ~-(uint)((int)uVar52 < (int)uStack_1ac) & uStack_1ac |
                               uVar52 & -(uint)((int)uVar52 < (int)uStack_1ac);
                  local_198._4_4_ =
                       local_198._4_4_ & -(uint)((int)uVar49 < (int)local_198._4_4_) |
                       ~-(uint)((int)uVar49 < (int)local_198._4_4_) & uVar49;
                  local_198._0_4_ =
                       local_198._0_4_ & -(uint)((int)uVar44 < (int)local_198._0_4_) |
                       ~-(uint)((int)uVar44 < (int)local_198._0_4_) & uVar44;
                  local_198._8_4_ =
                       local_198._8_4_ & -(uint)((int)uVar51 < (int)local_198._8_4_) |
                       ~-(uint)((int)uVar51 < (int)local_198._8_4_) & uVar51;
                  local_198._12_4_ =
                       local_198._12_4_ & -(uint)((int)uVar52 < (int)local_198._12_4_) |
                       ~-(uint)((int)uVar52 < (int)local_198._12_4_) & uVar52;
                }
                uVar36 = uVar16 & uVar32 | ~uVar32 & uVar36;
                uVar38 = uVar16 & uVar33 | ~uVar33 & uVar38;
                uVar40 = uVar16 & uVar34 | ~uVar34 & uVar40;
                uVar19 = uVar16 & uVar19 | ~uVar19 & uVar42;
                ptr_00[uVar7] = uVar44;
                ptr_01[uVar7] = ~uVar32 & uVar20 | uVar16 & uVar32;
                uVar37 = ~((int)uVar27 >> 0x1f) & -(uint)((int)uVar27 < local_78) & local_118 &
                         -(uint)((int)local_d8[0] < (int)uVar44);
                uVar39 = ~((int)uVar28 >> 0x1f) & -(uint)((int)uVar28 < iStack_74) & uStack_114 &
                         -(uint)((int)local_d8[1] < (int)uVar49);
                uVar41 = ~((int)uVar29 >> 0x1f) & -(uint)((int)uVar29 < iStack_70) & uStack_110 &
                         -(uint)((int)local_d8[2] < (int)uVar51);
                uVar43 = ~((int)uVar30 >> 0x1f) & -(uint)((int)uVar30 < iStack_6c) & uStack_10c &
                         -(uint)((int)local_d8[3] < (int)uVar52);
                uVar42 = -(uint)((int)local_e8[0] < (int)uVar44 &&
                                ((int)local_178 < (int)local_58 && local_68 == uVar27));
                uVar22 = -(uint)((int)local_e8[1] < (int)uVar49 &&
                                ((int)uStack_174 < (int)uStack_54 && uStack_64 == uVar28));
                uVar24 = -(uint)((int)local_e8[2] < (int)uVar51 &&
                                ((int)uStack_170 < (int)uStack_50 && uStack_60 == uVar29));
                uVar26 = -(uint)((int)local_e8[3] < (int)uVar52 &&
                                ((int)uStack_16c < (int)uStack_4c && uStack_5c == uVar30));
                local_d8[0] = uVar21 & uVar37 | ~uVar37 & local_d8[0];
                local_d8[1] = uVar23 & uVar39 | ~uVar39 & local_d8[1];
                local_d8[2] = uVar25 & uVar41 | ~uVar41 & local_d8[2];
                local_d8[3] = uVar35 & uVar43 | ~uVar43 & local_d8[3];
                uVar32 = -(uint)(local_68 == uVar27 && local_98 == local_178);
                uVar33 = -(uint)(uStack_64 == uVar28 && uStack_94 == uStack_174);
                uVar34 = -(uint)(uStack_60 == uVar29 && uStack_90 == uStack_170);
                uVar20 = -(uint)(uStack_5c == uVar30 && uStack_8c == uStack_16c);
                local_e8[0] = uVar44 & uVar42 | ~uVar42 & local_e8[0];
                local_e8[1] = uVar49 & uVar22 | ~uVar22 & local_e8[1];
                local_e8[2] = uVar51 & uVar24 | ~uVar24 & local_e8[2];
                local_e8[3] = uVar52 & uVar26 | ~uVar26 & local_e8[3];
                local_f8[0] = ~uVar32 & local_f8[0] | uVar44 & uVar32;
                local_f8[1] = ~uVar33 & local_f8[1] | uVar49 & uVar33;
                local_f8[2] = ~uVar34 & local_f8[2] | uVar51 & uVar34;
                local_f8[3] = ~uVar20 & local_f8[3] | uVar52 & uVar20;
                local_138[0] = ~uVar42 & local_138[0] | local_178 & uVar42;
                local_138[1] = ~uVar22 & local_138[1] | uStack_174 & uVar22;
                local_138[2] = ~uVar24 & local_138[2] | uStack_170 & uVar24;
                local_138[3] = ~uVar26 & local_138[3] | uStack_16c & uVar26;
                local_108[0] = ~uVar37 & local_108[0] | uVar27 & uVar37;
                local_108[1] = ~uVar39 & local_108[1] | uVar28 & uVar39;
                local_108[2] = ~uVar41 & local_108[2] | uVar29 & uVar41;
                local_108[3] = ~uVar43 & local_108[3] | uVar30 & uVar43;
                uVar27 = uVar27 + 1;
                uVar28 = uVar28 + 1;
                uVar29 = uVar29 + 1;
                uVar30 = uVar30 + 1;
                uVar7 = uVar7 + 1;
                uVar32 = uVar48;
                uVar33 = uVar50;
                uVar34 = uVar10;
                iVar31 = iVar2;
                uVar48 = uVar49;
                uVar50 = uVar51;
                uVar10 = uVar52;
              } while (uVar8 != uVar7);
              local_178 = local_178 + 4;
              uStack_174 = uStack_174 + 4;
              uStack_170 = uStack_170 + 4;
              uStack_16c = uStack_16c + 4;
              local_158._4_4_ = local_158._4_4_ - iStack_b4;
              local_158._0_4_ = local_158._0_4_ - local_b8;
              local_158._8_4_ = local_158._8_4_ - iStack_b0;
              local_158._12_4_ = local_158._12_4_ - iStack_ac;
              uVar7 = local_c8;
            } while (uVar6 < local_c8);
          }
          lVar5 = 0;
          uVar15 = 0;
          uVar14 = 0;
          uVar10 = uVar16;
          uVar12 = uVar16;
          uVar13 = uVar16;
          do {
            uVar3 = local_e8[lVar5];
            if (((int)uVar12 < (int)uVar3) ||
               ((uVar3 == uVar12 && ((int)local_138[lVar5] < (int)uVar15)))) {
              uVar15 = local_138[lVar5];
              uVar12 = uVar3;
            }
            if ((int)uVar13 < (int)local_d8[lVar5]) {
              uVar14 = local_108[lVar5];
              uVar13 = local_d8[lVar5];
            }
            if ((int)uVar10 < (int)local_f8[lVar5]) {
              uVar10 = local_f8[lVar5];
            }
            lVar5 = lVar5 + 1;
          } while ((int)lVar5 != 4);
          if (s1_end == 0 || s2_end == 0) {
            if (s1_end == 0) {
              uVar15 = _s1Len - 1;
              uVar3 = s2Len - 1;
              if (s2_end != 0) {
                uVar3 = uVar14;
                uVar10 = uVar13;
              }
            }
            else {
              uVar3 = s2Len - 1;
              uVar10 = uVar12;
            }
          }
          else if (((int)uVar13 < (int)uVar12) || (s2Len - 1U == uVar14 && uVar12 == uVar13)) {
            uVar3 = s2Len - 1;
            uVar10 = uVar12;
          }
          else {
            uVar15 = _s1Len - 1;
            uVar3 = uVar14;
            uVar10 = uVar13;
          }
          auVar17._0_4_ = -(uint)((int)local_1b8 < (int)uVar16);
          auVar17._4_4_ = -(uint)((int)uStack_1b4 < (int)uVar16);
          auVar17._8_4_ = -(uint)((int)uStack_1b0 < (int)uVar16);
          auVar17._12_4_ = -(uint)((int)uStack_1ac < (int)uVar16);
          auVar18._0_4_ = -(uint)((int)local_128 < (int)local_198._0_4_);
          auVar18._4_4_ = -(uint)((int)uStack_124 < (int)local_198._4_4_);
          auVar18._8_4_ = -(uint)((int)uStack_120 < (int)local_198._8_4_);
          auVar18._12_4_ = -(uint)((int)uStack_11c < (int)local_198._12_4_);
          iVar9 = movmskps(uVar13,auVar18 | auVar17);
          if (iVar9 != 0) {
            *(byte *)&ppVar4->flag = (byte)ppVar4->flag | 0x40;
            uVar10 = 0;
            uVar3 = 0;
            uVar15 = 0;
          }
          ppVar4->score = uVar10;
          ppVar4->end_query = uVar15;
          ppVar4->end_ref = uVar3;
          parasail_free(ptr_01);
          parasail_free(ptr_00);
          parasail_free(ptr);
          if (matrix->type == 0) {
            parasail_free(ptr_02);
            return ppVar4;
          }
          return ppVar4;
        }
      }
    }
  }
  return (parasail_result_t *)0x0;
}

Assistant:

parasail_result_t* FNAME(
        const char * const restrict _s1, const int _s1Len,
        const char * const restrict _s2, const int s2Len,
        const int open, const int gap, const parasail_matrix_t *matrix,
        int s1_beg, int s1_end, int s2_beg, int s2_end)
{
    /* declare local variables */
    int32_t N = 0;
    int32_t PAD = 0;
    int32_t PAD2 = 0;
    int32_t s1Len = 0;
    int32_t s1Len_PAD = 0;
    int32_t s2Len_PAD = 0;
    int32_t * restrict s1 = NULL;
    int32_t * restrict s2B = NULL;
    int32_t * restrict _H_pr = NULL;
    int32_t * restrict _F_pr = NULL;
    int32_t * restrict s2 = NULL;
    int32_t * restrict H_pr = NULL;
    int32_t * restrict F_pr = NULL;
    parasail_result_t *result = NULL;
    int32_t i = 0;
    int32_t j = 0;
    int32_t end_query = 0;
    int32_t end_ref = 0;
    int32_t NEG_LIMIT = 0;
    int32_t POS_LIMIT = 0;
    int32_t score = 0;
    __m128i vNegLimit;
    __m128i vPosLimit;
    __m128i vSaturationCheckMin;
    __m128i vSaturationCheckMax;
    __m128i vNegInf;
    __m128i vOpen;
    __m128i vGap;
    __m128i vOne;
    __m128i vN;
    __m128i vGapN;
    __m128i vNegOne;
    __m128i vI;
    __m128i vJreset;
    __m128i vMaxHRow;
    __m128i vMaxHCol;
    __m128i vLastVal;
    __m128i vEndI;
    __m128i vEndJ;
    __m128i vILimit;
    __m128i vILimit1;
    __m128i vJLimit;
    __m128i vJLimit1;
    __m128i vIBoundary;

    /* validate inputs */
    PARASAIL_CHECK_NULL(_s2);
    PARASAIL_CHECK_GT0(s2Len);
    PARASAIL_CHECK_GE0(open);
    PARASAIL_CHECK_GE0(gap);
    PARASAIL_CHECK_NULL(matrix);
    if (matrix->type == PARASAIL_MATRIX_TYPE_SQUARE) {
        PARASAIL_CHECK_NULL(_s1);
        PARASAIL_CHECK_GT0(_s1Len);
    }

    /* initialize stack variables */
    N = 4; /* number of values in vector */
    PAD = N-1;
    PAD2 = PAD*2;
    s1Len = matrix->type == PARASAIL_MATRIX_TYPE_SQUARE ? _s1Len : matrix->length;
    s1Len_PAD = s1Len+PAD;
    s2Len_PAD = s2Len+PAD;
    i = 0;
    j = 0;
    end_query = 0;
    end_ref = 0;
    NEG_LIMIT = (-open < matrix->min ? INT32_MIN + open : INT32_MIN - matrix->min) + 1;
    POS_LIMIT = INT32_MAX - matrix->max - 1;
    score = NEG_LIMIT;
    vNegLimit = _mm_set1_epi32(NEG_LIMIT);
    vPosLimit = _mm_set1_epi32(POS_LIMIT);
    vSaturationCheckMin = vPosLimit;
    vSaturationCheckMax = vNegLimit;
    vNegInf = _mm_set1_epi32(NEG_LIMIT);
    vOpen = _mm_set1_epi32(open);
    vGap  = _mm_set1_epi32(gap);
    vOne = _mm_set1_epi32(1);
    vN = _mm_set1_epi32(N);
    vGapN = s1_beg ? _mm_set1_epi32(0) : _mm_set1_epi32(gap*N);
    vNegOne = _mm_set1_epi32(-1);
    vI = _mm_set_epi32(0,1,2,3);
    vJreset = _mm_set_epi32(0,-1,-2,-3);
    vMaxHRow = vNegInf;
    vMaxHCol = vNegInf;
    vLastVal = vNegInf;
    vEndI = vNegInf;
    vEndJ = vNegInf;
    vILimit = _mm_set1_epi32(s1Len);
    vILimit1 = _mm_sub_epi32(vILimit, vOne);
    vJLimit = _mm_set1_epi32(s2Len);
    vJLimit1 = _mm_sub_epi32(vJLimit, vOne);
    vIBoundary = s1_beg ? _mm_set1_epi32(0) : _mm_set_epi32(
            -open-0*gap,
            -open-1*gap,
            -open-2*gap,
            -open-3*gap);

    /* initialize result */
#ifdef PARASAIL_TABLE
    result = parasail_result_new_table1(s1Len, s2Len);
#else
#ifdef PARASAIL_ROWCOL
    result = parasail_result_new_rowcol1(s1Len, s2Len);
#else
    result = parasail_result_new();
#endif
#endif
    if (!result) return NULL;

    /* set known flags */
    result->flag |= PARASAIL_FLAG_SG | PARASAIL_FLAG_DIAG
        | PARASAIL_FLAG_BITS_32 | PARASAIL_FLAG_LANES_4;
    result->flag |= s1_beg ? PARASAIL_FLAG_SG_S1_BEG : 0;
    result->flag |= s1_end ? PARASAIL_FLAG_SG_S1_END : 0;
    result->flag |= s2_beg ? PARASAIL_FLAG_SG_S2_BEG : 0;
    result->flag |= s2_end ? PARASAIL_FLAG_SG_S2_END : 0;
#ifdef PARASAIL_TABLE
    result->flag |= PARASAIL_FLAG_TABLE;
#endif
#ifdef PARASAIL_ROWCOL
    result->flag |= PARASAIL_FLAG_ROWCOL;
#endif

    /* initialize heap variables */
    s2B= parasail_memalign_int32_t(16, s2Len+PAD2);
    _H_pr = parasail_memalign_int32_t(16, s2Len+PAD2);
    _F_pr = parasail_memalign_int32_t(16, s2Len+PAD2);
    s2 = s2B+PAD; /* will allow later for negative indices */
    H_pr = _H_pr+PAD;
    F_pr = _F_pr+PAD;

    /* validate heap variables */
    if (!s2B) return NULL;
    if (!_H_pr) return NULL;
    if (!_F_pr) return NULL;

    /* convert _s1 from char to int in range 0-23 */
    if (matrix->type == PARASAIL_MATRIX_TYPE_SQUARE) {
        s1 = parasail_memalign_int32_t(16, s1Len+PAD);
        if (!s1) return NULL;
        for (i=0; i<s1Len; ++i) {
            s1[i] = matrix->mapper[(unsigned char)_s1[i]];
        }
        /* pad back of s1 with dummy values */
        for (i=s1Len; i<s1Len_PAD; ++i) {
            s1[i] = 0; /* point to first matrix row because we don't care */
        }
    }

    /* convert _s2 from char to int in range 0-23 */
    for (j=0; j<s2Len; ++j) {
        s2[j] = matrix->mapper[(unsigned char)_s2[j]];
    }
    /* pad front of s2 with dummy values */
    for (j=-PAD; j<0; ++j) {
        s2[j] = 0; /* point to first matrix row because we don't care */
    }
    /* pad back of s2 with dummy values */
    for (j=s2Len; j<s2Len_PAD; ++j) {
        s2[j] = 0; /* point to first matrix row because we don't care */
    }

    /* set initial values for stored row */
    if (s2_beg) {
        for (j=0; j<s2Len; ++j) {
            H_pr[j] = 0;
            F_pr[j] = NEG_LIMIT;
        }
    }
    else {
        for (j=0; j<s2Len; ++j) {
            H_pr[j] = -open - j*gap;
            F_pr[j] = NEG_LIMIT;
        }
    }
    /* pad front of stored row values */
    for (j=-PAD; j<0; ++j) {
        H_pr[j] = NEG_LIMIT;
        F_pr[j] = NEG_LIMIT;
    }
    /* pad back of stored row values */
    for (j=s2Len; j<s2Len+PAD; ++j) {
        H_pr[j] = NEG_LIMIT;
        F_pr[j] = NEG_LIMIT;
    }
    H_pr[-1] = 0; /* upper left corner */

    /* iterate over query sequence */
    for (i=0; i<s1Len; i+=N) {
        __m128i vNH = vNegInf;
        __m128i vWH = vNegInf;
        __m128i vE = vNegInf;
        __m128i vF = vNegInf;
        __m128i vJ = vJreset;
        const int * const restrict matrow0 = &matrix->matrix[matrix->size * ((matrix->type == PARASAIL_MATRIX_TYPE_SQUARE) ? s1[i+0] : ((i+0 >= s1Len) ? s1Len-1 : i+0))];
        const int * const restrict matrow1 = &matrix->matrix[matrix->size * ((matrix->type == PARASAIL_MATRIX_TYPE_SQUARE) ? s1[i+1] : ((i+1 >= s1Len) ? s1Len-1 : i+1))];
        const int * const restrict matrow2 = &matrix->matrix[matrix->size * ((matrix->type == PARASAIL_MATRIX_TYPE_SQUARE) ? s1[i+2] : ((i+2 >= s1Len) ? s1Len-1 : i+2))];
        const int * const restrict matrow3 = &matrix->matrix[matrix->size * ((matrix->type == PARASAIL_MATRIX_TYPE_SQUARE) ? s1[i+3] : ((i+3 >= s1Len) ? s1Len-1 : i+3))];
        __m128i vIltLimit = _mm_cmplt_epi32(vI, vILimit);
        __m128i vIeqLimit1 = _mm_cmpeq_epi32(vI, vILimit1);
        vNH = _mm_srli_si128(vNH, 4);
        vNH = _mm_insert_epi32_rpl(vNH, H_pr[-1], 3);
        vWH = _mm_srli_si128(vWH, 4);
        vWH = _mm_insert_epi32_rpl(vWH, s1_beg ? 0 : (-open - i*gap), 3);
        H_pr[-1] = -open - (i+N)*gap;
        /* iterate over database sequence */
        for (j=0; j<s2Len+PAD; ++j) {
            __m128i vMat;
            __m128i vNWH = vNH;
            vNH = _mm_srli_si128(vWH, 4);
            vNH = _mm_insert_epi32_rpl(vNH, H_pr[j], 3);
            vF = _mm_srli_si128(vF, 4);
            vF = _mm_insert_epi32_rpl(vF, F_pr[j], 3);
            vF = _mm_max_epi32_rpl(
                    _mm_sub_epi32(vNH, vOpen),
                    _mm_sub_epi32(vF, vGap));
            vE = _mm_max_epi32_rpl(
                    _mm_sub_epi32(vWH, vOpen),
                    _mm_sub_epi32(vE, vGap));
            vMat = _mm_set_epi32(
                    matrow0[s2[j-0]],
                    matrow1[s2[j-1]],
                    matrow2[s2[j-2]],
                    matrow3[s2[j-3]]
                    );
            vNWH = _mm_add_epi32(vNWH, vMat);
            vWH = _mm_max_epi32_rpl(vNWH, vE);
            vWH = _mm_max_epi32_rpl(vWH, vF);
            /* as minor diagonal vector passes across the j=-1 boundary,
             * assign the appropriate boundary conditions */
            {
                __m128i cond = _mm_cmpeq_epi32(vJ,vNegOne);
                vWH = _mm_blendv_epi8_rpl(vWH, vIBoundary, cond);
                vF = _mm_blendv_epi8_rpl(vF, vNegInf, cond);
                vE = _mm_blendv_epi8_rpl(vE, vNegInf, cond);
            }
            /* cannot start checking sat until after J clears boundary */
            if (j > PAD) {
                vSaturationCheckMin = _mm_min_epi32_rpl(vSaturationCheckMin, vWH);
                vSaturationCheckMax = _mm_max_epi32_rpl(vSaturationCheckMax, vWH);
            }
#ifdef PARASAIL_TABLE
            arr_store_si128(result->tables->score_table, vWH, i, s1Len, j, s2Len);
#endif
#ifdef PARASAIL_ROWCOL
            arr_store_rowcol(result->rowcols->score_row, result->rowcols->score_col, vWH, i, s1Len, j, s2Len);
#endif
            H_pr[j-3] = (int32_t)_mm_extract_epi32_rpl(vWH,0);
            F_pr[j-3] = (int32_t)_mm_extract_epi32_rpl(vF,0);
            /* as minor diagonal vector passes across the i or j limit
             * boundary, extract the last value of the column or row */
            {
                __m128i vJeqLimit1 = _mm_cmpeq_epi32(vJ, vJLimit1);
                __m128i vJgtNegOne = _mm_cmpgt_epi32(vJ, vNegOne);
                __m128i vJltLimit = _mm_cmplt_epi32(vJ, vJLimit);
                __m128i cond_j = _mm_and_si128(vIltLimit, vJeqLimit1);
                __m128i cond_i = _mm_and_si128(vIeqLimit1,
                        _mm_and_si128(vJgtNegOne, vJltLimit));
                __m128i cond_max_row = _mm_cmpgt_epi32(vWH, vMaxHRow);
                __m128i cond_max_col = _mm_cmpgt_epi32(vWH, vMaxHCol);
                __m128i cond_last_val = _mm_and_si128(vIeqLimit1, vJeqLimit1);
                __m128i cond_all_row = _mm_and_si128(cond_max_row, cond_i);
                __m128i cond_all_col = _mm_and_si128(cond_max_col, cond_j);
                vMaxHRow = _mm_blendv_epi8_rpl(vMaxHRow, vWH, cond_all_row);
                vMaxHCol = _mm_blendv_epi8_rpl(vMaxHCol, vWH, cond_all_col);
                vLastVal = _mm_blendv_epi8_rpl(vLastVal, vWH, cond_last_val);
                vEndI = _mm_blendv_epi8_rpl(vEndI, vI, cond_all_col);
                vEndJ = _mm_blendv_epi8_rpl(vEndJ, vJ, cond_all_row);
            }
            vJ = _mm_add_epi32(vJ, vOne);
        }
        vI = _mm_add_epi32(vI, vN);
        vIBoundary = _mm_sub_epi32(vIBoundary, vGapN);
    }

    /* alignment ending position */
    {
        int32_t max_row = NEG_LIMIT;
        int32_t max_col = NEG_LIMIT;
        int32_t last_val = NEG_LIMIT;
        int32_t *s = (int32_t*)&vMaxHRow;
        int32_t *t = (int32_t*)&vMaxHCol;
        int32_t *u = (int32_t*)&vLastVal;
        int32_t *i = (int32_t*)&vEndI;
        int32_t *j = (int32_t*)&vEndJ;
        int32_t k;
        for (k=0; k<N; ++k, ++s, ++t, ++u, ++i, ++j) {
            if (*t > max_col || (*t == max_col && *i < end_query)) {
                max_col = *t;
                end_query = *i;
            }
            if (*s > max_row) {
                max_row = *s;
                end_ref = *j;
            }
            if (*u > last_val) {
                last_val = *u;
            }
        }
        if (s1_end && s2_end) {
            if (max_col > max_row || (max_col == max_row && end_ref == s2Len-1)) {
                score = max_col;
                end_ref = s2Len-1;
            }
            else {
                score = max_row;
                end_query = s1Len-1;
            }
        }
        else if (s1_end) {
            score = max_col;
            end_ref = s2Len-1;
        }
        else if (s2_end) {
            score = max_row;
            end_query = s1Len-1;
        }
        else {
            score = last_val;
            end_query = s1Len-1;
            end_ref = s2Len-1;
        }
    }

    if (_mm_movemask_epi8(_mm_or_si128(
            _mm_cmplt_epi32(vSaturationCheckMin, vNegLimit),
            _mm_cmpgt_epi32(vSaturationCheckMax, vPosLimit)))) {
        result->flag |= PARASAIL_FLAG_SATURATED;
        score = 0;
        end_query = 0;
        end_ref = 0;
    }

    result->score = score;
    result->end_query = end_query;
    result->end_ref = end_ref;

    parasail_free(_F_pr);
    parasail_free(_H_pr);
    parasail_free(s2B);
    if (matrix->type == PARASAIL_MATRIX_TYPE_SQUARE) {
        parasail_free(s1);
    }

    return result;
}